

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O2

VkCopyAccelerationStructureModeKHR
Diligent::CopyASModeToVkCopyAccelerationStructureMode(COPY_AS_MODE Mode)

{
  VkCopyAccelerationStructureModeKHR VVar1;
  undefined7 in_register_00000039;
  string msg;
  
  VVar1 = (VkCopyAccelerationStructureModeKHR)CONCAT71(in_register_00000039,Mode);
  if (VVar1 != VK_COPY_ACCELERATION_STRUCTURE_MODE_CLONE_KHR) {
    if (VVar1 == VK_COPY_ACCELERATION_STRUCTURE_MODE_COMPACT_KHR) {
      VVar1 = VK_COPY_ACCELERATION_STRUCTURE_MODE_COMPACT_KHR;
    }
    else {
      FormatString<char[21]>(&msg,(char (*) [21])"unknown AS copy mode");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CopyASModeToVkCopyAccelerationStructureMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x719);
      std::__cxx11::string::~string((string *)&msg);
      VVar1 = VK_COPY_ACCELERATION_STRUCTURE_MODE_MAX_ENUM_KHR;
    }
  }
  return VVar1;
}

Assistant:

VkCopyAccelerationStructureModeKHR CopyASModeToVkCopyAccelerationStructureMode(COPY_AS_MODE Mode)
{
    static_assert(COPY_AS_MODE_LAST == COPY_AS_MODE_COMPACT,
                  "Please update the switch below to handle the new copy AS mode");

    switch (Mode)
    {
        // clang-format off
        case COPY_AS_MODE_CLONE:   return VK_COPY_ACCELERATION_STRUCTURE_MODE_CLONE_KHR;
        case COPY_AS_MODE_COMPACT: return VK_COPY_ACCELERATION_STRUCTURE_MODE_COMPACT_KHR;
        // clang-format on
        default:
            UNEXPECTED("unknown AS copy mode");
            return VK_COPY_ACCELERATION_STRUCTURE_MODE_MAX_ENUM_KHR;
    }
}